

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O3

Index __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::find_prime_in_row(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                    *this,Index row)

{
  pointer pVVar1;
  pointer pAVar2;
  pointer pAVar3;
  runtime_error *this_00;
  
  pVVar1 = (this->graph_->vertices_).
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = *(pointer *)&((Adjacencies *)((long)(pVVar1 + row) + 0x20))->vector_;
  pAVar2 = *(pointer *)((long)(pVVar1 + row) + 0x28);
  if (pAVar3 != pAVar2) {
    do {
      if ((this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[pAVar3->edge_] == 2) {
        return pAVar3->vertex_;
      }
      pAVar3 = pAVar3 + 1;
    } while (pAVar3 != pAVar2);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not find prime in given row!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename Matching<GRAPH, COST, MASK>::Index
Matching<GRAPH, COST, MASK>::find_prime_in_row(Index const row) const
{

    for (auto it = graph_.adjacenciesFromVertexBegin(row);
         it != graph_.adjacenciesFromVertexEnd(row); ++it)
        if (mask_[it->edge()] == PRIMED)
            return it->vertex();

    throw std::runtime_error("Could not find prime in given row!");
}